

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderManager.cpp
# Opt level: O1

LayerHandle __thiscall Rml::RenderManager::GetNextLayer(RenderManager *this)

{
  pointer puVar1;
  code *pcVar2;
  bool bVar3;
  LayerHandle LVar4;
  ulong uVar5;
  
  if ((this->render_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (this->render_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    bVar3 = Assert("RMLUI_ASSERT(!render_stack.empty())",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/RenderManager.cpp"
                   ,0x155);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  puVar1 = (this->render_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->render_stack).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (uVar5 < 9) {
    LVar4 = 0;
  }
  else {
    LVar4 = *(LayerHandle *)((long)puVar1 + (uVar5 - 0x10));
  }
  return LVar4;
}

Assistant:

LayerHandle RenderManager::GetNextLayer() const
{
	RMLUI_ASSERT(!render_stack.empty());
	return render_stack.size() < 2 ? LayerHandle{} : render_stack[render_stack.size() - 2];
}